

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multilayer_metadata.cc
# Opt level: O0

bool libaom_examples::anon_unknown_0::parse_color_properties
               (ifstream *file,int min_indent,int *line_idx,ColorProperties *color)

{
  undefined1 uVar1;
  bool bVar2;
  undefined8 uVar3;
  undefined4 *in_RCX;
  uint *in_RDX;
  bool syntax_error;
  ParsedValue value;
  string field_name;
  int indent;
  bool has_list_prefix;
  int *in_stack_000000a8;
  bool *in_stack_000000b0;
  int *in_stack_000000b8;
  bool in_stack_000000c3;
  int in_stack_000000c4;
  ifstream *in_stack_000000c8;
  string *in_stack_000000e0;
  ParsedValue *in_stack_000000e8;
  bool *in_stack_000000f0;
  char *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  bool *v;
  undefined8 in_stack_ffffffffffffff70;
  FILE *__stream;
  undefined7 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  ParsedValue *in_stack_ffffffffffffff88;
  bool local_69;
  undefined1 local_68 [56];
  undefined4 local_30;
  undefined4 *local_28;
  uint *local_20;
  byte local_1;
  
  local_30 = 0xffffffff;
  local_28 = in_RCX;
  local_20 = in_RDX;
  std::__cxx11::string::string((string *)(local_68 + 0x18));
  ParsedValue::ParsedValue((ParsedValue *)local_68);
  *local_28 = 0;
  do {
    while( true ) {
      v = &local_69;
      __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68;
      __rhs = local_68 + 0x18;
      uVar1 = parse_line(in_stack_000000c8,in_stack_000000c4,in_stack_000000c3,in_stack_000000b8,
                         in_stack_000000b0,in_stack_000000a8,in_stack_000000e0,in_stack_000000e8,
                         in_stack_000000f0);
      if (!(bool)uVar1) {
        if ((local_69 & 1U) == 0) {
          local_1 = 1;
        }
        else {
          local_1 = 0;
        }
        goto LAB_0012f64b;
      }
      bVar2 = std::operator==(__lhs,__rhs);
      if (bVar2) break;
      bVar2 = std::operator==(__lhs,__rhs);
      if (bVar2) {
        bVar2 = ParsedValue::IntegerValueInRange<unsigned_char>
                          (in_stack_ffffffffffffff88,
                           CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                           CONCAT17(uVar1,in_stack_ffffffffffffff78),
                           (int)((ulong)in_stack_ffffffffffffff70 >> 0x20),v);
        if (!bVar2) {
          local_1 = 0;
          goto LAB_0012f64b;
        }
      }
      else {
        bVar2 = std::operator==(__lhs,__rhs);
        if (bVar2) {
          bVar2 = ParsedValue::IntegerValueInRange<unsigned_char>
                            (in_stack_ffffffffffffff88,
                             CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                             CONCAT17(uVar1,in_stack_ffffffffffffff78),
                             (int)((ulong)in_stack_ffffffffffffff70 >> 0x20),v);
          if (!bVar2) {
            local_1 = 0;
            goto LAB_0012f64b;
          }
        }
        else {
          bVar2 = std::operator==(__lhs,__rhs);
          if (!bVar2) {
            __stream = _stderr;
            uVar3 = std::__cxx11::string::c_str();
            fprintf(__stream,"Error: Unknown field \'%s\' at line %d\n",uVar3,(ulong)*local_20);
            local_1 = 0;
            goto LAB_0012f64b;
          }
          bVar2 = ParsedValue::IntegerValueInRange<unsigned_char>
                            (in_stack_ffffffffffffff88,
                             CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                             CONCAT17(uVar1,in_stack_ffffffffffffff78),
                             (int)((ulong)in_stack_ffffffffffffff70 >> 0x20),v);
          if (!bVar2) {
            local_1 = 0;
            goto LAB_0012f64b;
          }
        }
      }
    }
    bVar2 = ParsedValue::IntegerValueInRange<bool>
                      (in_stack_ffffffffffffff88,
                       CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                       CONCAT17(uVar1,in_stack_ffffffffffffff78),
                       (int)((ulong)in_stack_ffffffffffffff70 >> 0x20),v);
  } while (bVar2);
  local_1 = 0;
LAB_0012f64b:
  std::__cxx11::string::~string((string *)(local_68 + 0x18));
  return (bool)(local_1 & 1);
}

Assistant:

bool parse_color_properties(std::ifstream &file, int min_indent, int *line_idx,
                            ColorProperties *color) {
  bool has_list_prefix;
  int indent = -1;
  std::string field_name;
  ParsedValue value;
  bool syntax_error;
  *color = {};
  while (parse_line(file, min_indent, /*is_list=*/false, &indent,
                    &has_list_prefix, line_idx, &field_name, &value,
                    &syntax_error)) {
    if (field_name == "color_range") {
      RETURN_IF_FALSE(value.IntegerValueInRange(/*min=*/0, /*max=*/1, *line_idx,
                                                &color->color_range));
    } else if (field_name == "color_primaries") {
      if (!value.IntegerValueInRange(/*min=*/0, /*max=*/255, *line_idx,
                                     &color->color_primaries)) {
        return false;
      }
    } else if (field_name == "transfer_characteristics") {
      RETURN_IF_FALSE(value.IntegerValueInRange(
          /*min=*/0, /*max=*/255, *line_idx, &color->transfer_characteristics));
    } else if (field_name == "matrix_coefficients") {
      RETURN_IF_FALSE(value.IntegerValueInRange(
          /*min=*/0, /*max=*/255, *line_idx, &color->matrix_coefficients));
    } else {
      fprintf(stderr, "Error: Unknown field '%s' at line %d\n",
              field_name.c_str(), *line_idx);
      return false;
    }
  }
  if (syntax_error) return false;
  return true;
}